

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CallbackFederate.hpp
# Opt level: O3

void __thiscall helics::CallbackFederate::clearNextTimeCallback(CallbackFederate *this)

{
  undefined1 *puVar1;
  code *pcVar2;
  
  pcVar2 = *(code **)&(this->super_CombinationFederate).super_ValueFederate.field_0x68;
  if (pcVar2 != (code *)0x0) {
    puVar1 = &(this->super_CombinationFederate).super_ValueFederate.field_0x58;
    (*pcVar2)(puVar1,puVar1,3);
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x68 = 0;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x70 = 0;
  }
  pcVar2 = *(code **)&(this->super_CombinationFederate).super_ValueFederate.field_0x88;
  if (pcVar2 != (code *)0x0) {
    puVar1 = &(this->super_CombinationFederate).super_ValueFederate.field_0x78;
    (*pcVar2)(puVar1,puVar1,3);
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x88 = 0;
    *(undefined8 *)&(this->super_CombinationFederate).super_ValueFederate.field_0x90 = 0;
  }
  return;
}

Assistant:

void clearNextTimeCallback()
    {
        nextTimeOperation1 = nullptr;
        nextTimeOperation2 = nullptr;
    }